

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetMaxStep(void *arkode_mem,sunrealtype hmax)

{
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  ARKodeMem ark_mem;
  sunrealtype hmax_inv;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x454,"ARKodeSetMaxStep",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_adaptive == 0) {
    arkProcessError(in_RDI,-0x30,0x45d,"ARKodeSetMaxStep",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"time-stepping module does not support temporal adaptivity");
    local_4 = -0x30;
  }
  else if (0.0 < in_XMM0_Qa) {
    if ((1.0 / in_XMM0_Qa) * in_RDI->hmin <= 1.0) {
      in_RDI->hmax_inv = 1.0 / in_XMM0_Qa;
      local_4 = 0;
    }
    else {
      arkProcessError(in_RDI,-0x16,0x46d,"ARKodeSetMaxStep",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"Inconsistent step size limits: hmin > hmax.");
      local_4 = -0x16;
    }
  }
  else {
    in_RDI->hmax_inv = 0.0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKodeSetMaxStep(void* arkode_mem, sunrealtype hmax)
{
  sunrealtype hmax_inv;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Passing a value <= 0 sets hmax = infinity */
  if (hmax <= ZERO)
  {
    ark_mem->hmax_inv = ZERO;
    return (ARK_SUCCESS);
  }

  /* check that hmax and hmin are agreeable */
  hmax_inv = ONE / hmax;
  if (hmax_inv * ark_mem->hmin > ONE)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_HMIN_HMAX);
    return (ARK_ILL_INPUT);
  }

  /* set the value */
  ark_mem->hmax_inv = hmax_inv;

  return (ARK_SUCCESS);
}